

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O3

void __thiscall
PyreNet::Perceptron::calculate
          (Perceptron *this,vector<double,_std::allocator<double>_> *input,Activation *activation)

{
  int iVar1;
  pointer pdVar2;
  undefined8 *puVar3;
  long lVar4;
  double dVar5;
  double extraout_XMM0_Qa;
  
  pdVar2 = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = this->inputSize;
  if ((long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3 != (long)iVar1) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_0010cca0;
    __cxa_throw(puVar3,&InvalidInputSize::typeinfo,std::exception::~exception);
  }
  if (iVar1 < 1) {
    dVar5 = 0.0;
  }
  else {
    dVar5 = 0.0;
    lVar4 = 0;
    do {
      dVar5 = dVar5 + pdVar2[lVar4] *
                      (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  (**activation->_vptr_Activation)
            (dVar5 + (this->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1],activation);
  this->cachedValue = extraout_XMM0_Qa;
  return;
}

Assistant:

void Perceptron::calculate(const std::vector<double> &input, Activation *activation) {
        if (input.size() != this->inputSize) {
            throw InvalidInputSize();
        }
        double weightedSum = 0;
        for (int i = 0; i < this->inputSize; i++) {
            weightedSum += input[i] * this->weights[i];
        }
        weightedSum += 1 * this->weights.back(); // bias term
        this->cachedValue = activation->activate(weightedSum);
    }